

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

TestOneof2_FooGroup * __thiscall
proto2_unittest::TestOneof2::_internal_mutable_foogroup(TestOneof2 *this)

{
  FooCase FVar1;
  Arena *arena;
  Message *pMVar2;
  TestOneof2 *this_local;
  
  FVar1 = foo_case(this);
  if (FVar1 != kFoogroup) {
    clear_foo(this);
    set_has_foogroup(this);
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    pMVar2 = (Message *)
             google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestOneof2_FooGroup>(arena);
    (this->field_0)._impl_.foo_.foo_message_ = pMVar2;
  }
  return (TestOneof2_FooGroup *)(this->field_0)._impl_.foo_.foo_message_;
}

Assistant:

inline ::proto2_unittest::TestOneof2_FooGroup* PROTOBUF_NONNULL TestOneof2::_internal_mutable_foogroup() {
  if (foo_case() != kFoogroup) {
    clear_foo();
    set_has_foogroup();
    _impl_.foo_.foogroup_ = reinterpret_cast<::google::protobuf::Message*>(
        ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestOneof2_FooGroup>(GetArena()));
  }
  return reinterpret_cast<::proto2_unittest::TestOneof2_FooGroup*>(_impl_.foo_.foogroup_);
}